

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flow.cc
# Opt level: O3

PcodeOp * __thiscall FlowInfo::target(FlowInfo *this,Address *addr)

{
  _Rb_tree_header *p_Var1;
  const_iterator cVar2;
  ostream *poVar3;
  LowlevelError *this_00;
  PcodeOp *pPVar4;
  long lVar5;
  ulong uVar6;
  ostringstream errmsg;
  string local_1c8;
  key_type local_1a8 [23];
  
  cVar2 = std::
          _Rb_tree<Address,_std::pair<const_Address,_FlowInfo::VisitStat>,_std::_Select1st<std::pair<const_Address,_FlowInfo::VisitStat>_>,_std::less<Address>,_std::allocator<std::pair<const_Address,_FlowInfo::VisitStat>_>_>
          ::find(&(this->visited)._M_t,addr);
  p_Var1 = &(this->visited)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)cVar2._M_node != p_Var1) {
    do {
      if (cVar2._M_node[1]._M_left != (_Base_ptr)0x0) {
        pPVar4 = PcodeOpBank::findOp(this->obank,(SeqNum *)&cVar2._M_node[1]._M_left);
        if (pPVar4 != (PcodeOp *)0x0) {
          return pPVar4;
        }
        break;
      }
      local_1a8[0].base = *(AddrSpace **)(cVar2._M_node + 1);
      local_1a8[0].offset =
           (long)&(cVar2._M_node[1]._M_parent)->_M_color + (long)*(int *)&cVar2._M_node[2]._M_parent
      ;
      if ((local_1a8[0].base)->highest < local_1a8[0].offset) {
        uVar6 = (local_1a8[0].base)->highest + 1;
        lVar5 = (long)local_1a8[0].offset % (long)uVar6;
        local_1a8[0].offset = (lVar5 >> 0x3f & uVar6) + lVar5;
      }
      cVar2 = std::
              _Rb_tree<Address,_std::pair<const_Address,_FlowInfo::VisitStat>,_std::_Select1st<std::pair<const_Address,_FlowInfo::VisitStat>_>,_std::less<Address>,_std::allocator<std::pair<const_Address,_FlowInfo::VisitStat>_>_>
              ::find(&(this->visited)._M_t,local_1a8);
    } while ((_Rb_tree_header *)cVar2._M_node != p_Var1);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"Could not find op at target address: (",0x26);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,(addr->base->name)._M_dataplus._M_p,
                      (addr->base->name)._M_string_length);
  local_1c8._M_dataplus._M_p._0_1_ = 0x2c;
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)&local_1c8,1);
  Address::printRaw(addr,(ostream *)local_1a8);
  local_1c8._M_dataplus._M_p._0_1_ = 0x29;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,(char *)&local_1c8,1);
  this_00 = (LowlevelError *)__cxa_allocate_exception(0x20);
  std::__cxx11::stringbuf::str();
  LowlevelError::LowlevelError(this_00,&local_1c8);
  __cxa_throw(this_00,&LowlevelError::typeinfo,LowlevelError::~LowlevelError);
}

Assistant:

PcodeOp *FlowInfo::target(const Address &addr) const

{
  map<Address,VisitStat>::const_iterator iter;

  iter = visited.find(addr);
  while(iter != visited.end()) {
    const SeqNum &seq( (*iter).second.seqnum );
    if (!seq.getAddr().isInvalid()) {
      PcodeOp *retop = obank.findOp(seq);
      if (retop != (PcodeOp *)0)
	return retop;
      break;
    }
    // Visit fall thru address in case of no-op
    iter = visited.find( (*iter).first + (*iter).second.size );
  }
  ostringstream errmsg;
  errmsg << "Could not find op at target address: (";
  errmsg << addr.getSpace()->getName() << ',';
  addr.printRaw(errmsg);
  errmsg << ')';
  throw LowlevelError(errmsg.str());
}